

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O3

bool mxx::impl::
     is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
               (int *begin,int *end,long param_3)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int result;
  int i;
  int local_54;
  comm local_50;
  
  piVar4 = begin;
  if (begin != end) {
    piVar1 = begin + 1;
    do {
      piVar3 = piVar1;
      piVar4 = end;
      if (piVar3 == end) break;
      piVar1 = piVar3 + 1;
      piVar4 = piVar3;
    } while (piVar3[-1] <= *piVar3);
  }
  bVar5 = piVar4 == end;
  if (*(int *)(param_3 + 0x10) != 1) {
    local_50._vptr_comm = (_func_int **)&PTR__comm_001a58a0;
    local_50.mpi_comm = (MPI_Comm)&ompi_mpi_comm_world;
    MPI_Comm_size(&ompi_mpi_comm_world,&local_50.m_size);
    MPI_Comm_rank(local_50.mpi_comm,&local_50.m_rank);
    local_50.do_free = false;
    iVar2 = right_shift<int>(end + -1,&local_50);
    mxx::comm::~comm(&local_50);
    bVar5 = *(int *)(param_3 + 0x14) < 1 && piVar4 == end;
    if ((0 < *(int *)(param_3 + 0x14)) && (piVar4 == end)) {
      bVar5 = iVar2 <= *begin;
    }
    local_50._vptr_comm = (_func_int **)CONCAT44(local_50._vptr_comm._4_4_,(uint)bVar5);
    MPI_Allreduce(&local_50,&local_54,1,&ompi_mpi_int,&ompi_mpi_op_land,*(undefined8 *)(param_3 + 8)
                 );
    bVar5 = local_54 != 0;
  }
  return bVar5;
}

Assistant:

bool is_sorted(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm)
{
    // get value type of underlying data
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;

    // check that it is locally sorted (int for MPI_Reduction)
    bool sorted = std::is_sorted(begin, end, comp);

    // if single process, this is it
    if (comm.size() == 1)
        return sorted;

    // compare if last element on left processor is not bigger than first
    // element on mine
    value_type left_el = mxx::right_shift(*(end-1));

    // check if sorted with respect to neighbors
    if (comm.rank() > 0) {
        sorted = sorted && !comp(*begin, left_el);
    }

    // now check that this condition is true for all processes
    return mxx::all_of(sorted, comm);
}